

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void lodepng_state_copy(LodePNGState *dest,LodePNGState *source)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  
  lodepng_state_cleanup(dest);
  memcpy(&dest->decoder,&source->decoder,0x19c);
  (dest->info_raw).colortype = LCT_RGBA;
  (dest->info_raw).bitdepth = 8;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (dest->info_raw).palette = (uchar *)auVar2._0_8_;
  (dest->info_raw).palettesize = auVar2._8_8_;
  (dest->info_raw).key_defined = auVar2._16_4_;
  (dest->info_raw).key_r = auVar2._20_4_;
  (dest->info_raw).key_g = auVar2._24_4_;
  (dest->info_raw).key_b = auVar2._28_4_;
  (dest->info_png).color.colortype = LCT_RGBA;
  (dest->info_png).color.bitdepth = 8;
  (dest->info_png).color.palette = (uchar *)auVar2._0_8_;
  (dest->info_png).color.palettesize = auVar2._8_8_;
  (dest->info_png).color.key_defined = auVar2._16_4_;
  (dest->info_png).color.key_r = auVar2._20_4_;
  (dest->info_png).color.key_g = auVar2._24_4_;
  (dest->info_png).color.key_b = auVar2._28_4_;
  (dest->info_png).interlace_method = 0;
  (dest->info_png).compression_method = 0;
  (dest->info_png).filter_method = 0;
  (dest->info_png).phys_defined = 0;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (dest->info_png).unknown_chunks_data[0] = (uchar *)auVar2._0_8_;
  (dest->info_png).unknown_chunks_data[1] = (uchar *)auVar2._8_8_;
  (dest->info_png).unknown_chunks_data[2] = (uchar *)auVar2._16_8_;
  (dest->info_png).unknown_chunks_size[0] = auVar2._24_8_;
  *(undefined1 (*) [32])((dest->info_png).unknown_chunks_data + 2) = auVar2;
  auVar3 = ZEXT464(0) << 0x40;
  (dest->info_png).background_defined = auVar3._0_4_;
  (dest->info_png).background_r = auVar3._4_4_;
  (dest->info_png).background_g = auVar3._8_4_;
  (dest->info_png).background_b = auVar3._12_4_;
  (dest->info_png).text_num = auVar3._16_8_;
  (dest->info_png).text_keys = (char **)auVar3._24_8_;
  (dest->info_png).text_strings = (char **)auVar3._32_8_;
  (dest->info_png).itext_num = auVar3._40_8_;
  (dest->info_png).itext_keys = (char **)auVar3._48_8_;
  (dest->info_png).itext_langtags = (char **)auVar3._56_8_;
  *(undefined1 (*) [64])((long)&(dest->info_png).text_num + 4) = auVar3;
  uVar1 = lodepng_color_mode_copy(&dest->info_raw,&source->info_raw);
  dest->error = uVar1;
  if (uVar1 == 0) {
    uVar1 = lodepng_info_copy(&dest->info_png,&source->info_png);
    dest->error = uVar1;
  }
  return;
}

Assistant:

void lodepng_state_copy(LodePNGState* dest, const LodePNGState* source)
{
  lodepng_state_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->info_raw);
  lodepng_info_init(&dest->info_png);
  dest->error = lodepng_color_mode_copy(&dest->info_raw, &source->info_raw); if(dest->error) return;
  dest->error = lodepng_info_copy(&dest->info_png, &source->info_png); if(dest->error) return;
}